

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

cmFortranSourceInfo * __thiscall
cmDependsFortranInternals::CreateObjectInfo(cmDependsFortranInternals *this,string *obj,string *src)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_cmFortranSourceInfo>_&>::value,_pair<iterator,_bool>_>
  _Var4;
  cmFortranSourceInfo local_1b8;
  undefined1 local_100 [8];
  value_type entry;
  _Self local_28;
  iterator i;
  string *src_local;
  string *obj_local;
  cmDependsFortranInternals *this_local;
  
  i._M_node = (_Base_ptr)src;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
       ::find(&this->ObjectInfo,obj);
  entry.second.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
               ::end(&this->ObjectInfo);
  bVar2 = std::operator==(&local_28,
                          (_Self *)&entry.second.Includes._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count);
  if (bVar2) {
    local_1b8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_1b8.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_1b8.Includes._M_t._M_impl._0_8_ = 0;
    local_1b8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1b8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_1b8.Requires._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_1b8.Requires._M_t._M_impl._0_8_ = 0;
    local_1b8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1b8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_1b8.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_1b8.Provides._M_t._M_impl._0_8_ = 0;
    local_1b8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1b8.Source.field_2._M_allocated_capacity = 0;
    local_1b8.Source.field_2._8_8_ = 0;
    local_1b8.Source._M_dataplus = (_Alloc_hider)0x0;
    local_1b8.Source._1_7_ = 0;
    local_1b8.Source._M_string_length = 0;
    cmFortranSourceInfo::cmFortranSourceInfo(&local_1b8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
    ::pair<cmFortranSourceInfo,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
                *)local_100,obj,&local_1b8);
    cmFortranSourceInfo::~cmFortranSourceInfo(&local_1b8);
    _Var4 = std::
            map<std::__cxx11::string,cmFortranSourceInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
            ::insert<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>&>
                      ((map<std::__cxx11::string,cmFortranSourceInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
                        *)&this->ObjectInfo,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
                        *)local_100);
    iVar1 = i;
    local_28._M_node = (_Base_ptr)_Var4.first._M_node;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
             ::operator->(&local_28);
    std::__cxx11::string::operator=((string *)&ppVar3->second,(string *)iVar1._M_node);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
             *)local_100);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
           ::operator->(&local_28);
  return &ppVar3->second;
}

Assistant:

cmFortranSourceInfo& CreateObjectInfo(const std::string& obj,
                                        const std::string& src)
  {
    std::map<std::string, cmFortranSourceInfo>::iterator i =
      this->ObjectInfo.find(obj);
    if (i == this->ObjectInfo.end()) {
      std::map<std::string, cmFortranSourceInfo>::value_type entry(
        obj, cmFortranSourceInfo());
      i = this->ObjectInfo.insert(entry).first;
      i->second.Source = src;
    }
    return i->second;
  }